

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_ntlm_core.c
# Opt level: O3

CURLcode Curl_ntlm_core_mk_lm_hash(char *password,uchar *lmbuffer)

{
  size_t n;
  uchar pw [14];
  DES_key_schedule ks;
  uchar local_b6 [7];
  uchar local_af [7];
  DES_key_schedule local_a8;
  
  n = strlen(password);
  if (0xd < n) {
    n = 0xe;
  }
  Curl_strntoupper((char *)local_b6,password,n);
  memset(local_b6 + n,0,0xe - n);
  setup_des_key(local_b6,&local_a8);
  DES_ecb_encrypt((const_DES_cblock *)"KGS!@#$%",(DES_cblock *)lmbuffer,
                  (DES_key_schedule *)&local_a8,1);
  setup_des_key(local_af,&local_a8);
  DES_ecb_encrypt((const_DES_cblock *)"KGS!@#$%",(DES_cblock *)(lmbuffer + 8),
                  (DES_key_schedule *)&local_a8,1);
  lmbuffer[0x14] = '\0';
  lmbuffer[0x10] = '\0';
  lmbuffer[0x11] = '\0';
  lmbuffer[0x12] = '\0';
  lmbuffer[0x13] = '\0';
  return CURLE_OK;
}

Assistant:

CURLcode Curl_ntlm_core_mk_lm_hash(const char *password,
                                   unsigned char *lmbuffer /* 21 bytes */)
{
  unsigned char pw[14];
#if !defined(CURL_NTLM_NOT_SUPPORTED)
  static const unsigned char magic[] = {
    0x4B, 0x47, 0x53, 0x21, 0x40, 0x23, 0x24, 0x25 /* i.e. KGS!@#$% */
  };
#endif
  size_t len = CURLMIN(strlen(password), 14);

  Curl_strntoupper((char *)pw, password, len);
  memset(&pw[len], 0, 14 - len);

  {
    /* Create LanManager hashed password. */

#if defined(USE_OPENSSL_DES)
    DES_key_schedule ks;

    setup_des_key(pw, DESKEY(ks));
    DES_ecb_encrypt((DES_cblock *)magic, (DES_cblock *)lmbuffer,
                    DESKEY(ks), DES_ENCRYPT);

    setup_des_key(pw + 7, DESKEY(ks));
    DES_ecb_encrypt((DES_cblock *)magic, (DES_cblock *)(lmbuffer + 8),
                    DESKEY(ks), DES_ENCRYPT);
#elif defined(USE_GNUTLS)
    struct des_ctx des;
    setup_des_key(pw, &des);
    des_encrypt(&des, 8, lmbuffer, magic);
    setup_des_key(pw + 7, &des);
    des_encrypt(&des, 8, lmbuffer + 8, magic);
#elif defined(USE_MBEDTLS) || defined(USE_SECTRANSP)            \
  || defined(USE_OS400CRYPTO) || defined(USE_WIN32_CRYPTO)
    encrypt_des(magic, lmbuffer, pw);
    encrypt_des(magic, lmbuffer + 8, pw + 7);
#endif

    memset(lmbuffer + 16, 0, 21 - 16);
  }

  return CURLE_OK;
}